

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fovYRadians,float aspect,float zNear,float zFar,
          bool directX)

{
  float *pfVar1;
  float fVar2;
  float xScale;
  float yScale;
  bool directX_local;
  float zFar_local;
  float zNear_local;
  float aspect_local;
  float fovYRadians_local;
  Matrix4f *m;
  
  if (zNear < 0.0) {
    __assert_fail("zNear >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/vecmath/Matrix4f.cpp"
                  ,0x26a,
                  "static Matrix4f Matrix4f::perspectiveProjection(float, float, float, float, bool)"
                 );
  }
  if (0.0 < zFar) {
    Matrix4f(__return_storage_ptr__,0.0);
    fVar2 = tanf(fovYRadians * 0.5);
    pfVar1 = operator()(__return_storage_ptr__,0,0);
    *pfVar1 = (1.0 / fVar2) / aspect;
    pfVar1 = operator()(__return_storage_ptr__,1,1);
    *pfVar1 = 1.0 / fVar2;
    pfVar1 = operator()(__return_storage_ptr__,3,2);
    *pfVar1 = -1.0;
    if (directX) {
      pfVar1 = operator()(__return_storage_ptr__,2,2);
      *pfVar1 = zFar / (zNear - zFar);
      pfVar1 = operator()(__return_storage_ptr__,2,3);
      *pfVar1 = (zNear * zFar) / (zNear - zFar);
    }
    else {
      pfVar1 = operator()(__return_storage_ptr__,2,2);
      *pfVar1 = (zFar + zNear) / (zNear - zFar);
      pfVar1 = operator()(__return_storage_ptr__,2,3);
      *pfVar1 = (zFar * 2.0 * zNear) / (zNear - zFar);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("zFar > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/vecmath/Matrix4f.cpp"
                ,0x26b,
                "static Matrix4f Matrix4f::perspectiveProjection(float, float, float, float, bool)")
  ;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fovYRadians, float aspect, float zNear, float zFar, bool directX )
{
	assert(zNear >= 0);
	assert(zFar > 0);
	Matrix4f m; // zero matrix

	float yScale = 1.f / tanf( 0.5f * fovYRadians );
	float xScale = yScale / aspect;

	m( 0, 0 ) = xScale;
	m( 1, 1 ) = yScale;
	m( 3, 2 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = zFar / ( zNear - zFar );
		m( 2, 3 ) = zNear * zFar / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = ( zFar + zNear ) / ( zNear - zFar );
		m( 2, 3 ) = 2.f * zFar * zNear / ( zNear - zFar );
	}

	return m;
}